

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O0

void __thiscall bsplib::Rdma::ActionBuf::push_back(ActionBuf *this,Action *action)

{
  reference pvVar1;
  Action *action_local;
  ActionBuf *this_local;
  
  std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::push_back
            (&this->m_actions,action);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_counts,(long)action->target_pid);
  *pvVar1 = *pvVar1 + 1;
  return;
}

Assistant:

void push_back( const Action & action )
        {   
            m_actions.push_back( action );
            m_counts[ action.target_pid ] += 1;
        }